

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

int ec_seckey_import_der(secp256k1_context *ctx,uchar *out32,uchar *seckey,size_t seckeylen)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  out32[0x10] = '\0';
  out32[0x11] = '\0';
  out32[0x12] = '\0';
  out32[0x13] = '\0';
  out32[0x14] = '\0';
  out32[0x15] = '\0';
  out32[0x16] = '\0';
  out32[0x17] = '\0';
  out32[0x18] = '\0';
  out32[0x19] = '\0';
  out32[0x1a] = '\0';
  out32[0x1b] = '\0';
  out32[0x1c] = '\0';
  out32[0x1d] = '\0';
  out32[0x1e] = '\0';
  out32[0x1f] = '\0';
  out32[0] = '\0';
  out32[1] = '\0';
  out32[2] = '\0';
  out32[3] = '\0';
  out32[4] = '\0';
  out32[5] = '\0';
  out32[6] = '\0';
  out32[7] = '\0';
  out32[8] = '\0';
  out32[9] = '\0';
  out32[10] = '\0';
  out32[0xb] = '\0';
  out32[0xc] = '\0';
  out32[0xd] = '\0';
  out32[0xe] = '\0';
  out32[0xf] = '\0';
  iVar4 = 0;
  iVar5 = 0;
  if ((((0 < (long)seckeylen) && (iVar5 = 0, seckeylen != 1)) && (iVar5 = iVar4, *seckey == '0')) &&
     ((char)seckey[1] < '\0')) {
    uVar7 = seckey[1] & 0x7f;
    uVar6 = (ulong)uVar7;
    bVar3 = (byte)uVar7;
    if ((long)uVar6 <= (long)(seckeylen - 2) && 0xfd < (byte)(bVar3 - 3)) {
      pbVar1 = seckey + 2 + uVar6;
      iVar5 = 0;
      if (bVar3 < 2) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)seckey[2] << 8;
      }
      if (((((2 < (long)(seckey + (seckeylen - (long)pbVar1))) &&
            ((long)(uVar8 | seckey[uVar6 + 1]) <= (long)(seckey + (seckeylen - (long)pbVar1)))) &&
           ((*pbVar1 == 2 && ((pbVar1[1] == 1 && (pbVar1[2] == 1)))))) &&
          (1 < (long)(seckey + (seckeylen - (long)(pbVar1 + 3))))) && (pbVar1[3] == 4)) {
        uVar6 = (ulong)pbVar1[4];
        if ((long)uVar6 <= (long)(seckey + (seckeylen - (long)(pbVar1 + 5))) && pbVar1[4] < 0x21) {
          memcpy(out32 + (0x20 - uVar6),pbVar1 + 5,uVar6);
          iVar4 = secp256k1_ec_seckey_verify(ctx,out32);
          iVar5 = 1;
          if (iVar4 == 0) {
            out32[0x10] = '\0';
            out32[0x11] = '\0';
            out32[0x12] = '\0';
            out32[0x13] = '\0';
            out32[0x14] = '\0';
            out32[0x15] = '\0';
            out32[0x16] = '\0';
            out32[0x17] = '\0';
            out32[0x18] = '\0';
            out32[0x19] = '\0';
            out32[0x1a] = '\0';
            out32[0x1b] = '\0';
            out32[0x1c] = '\0';
            out32[0x1d] = '\0';
            out32[0x1e] = '\0';
            out32[0x1f] = '\0';
            out32[0] = '\0';
            out32[1] = '\0';
            out32[2] = '\0';
            out32[3] = '\0';
            out32[4] = '\0';
            out32[5] = '\0';
            out32[6] = '\0';
            out32[7] = '\0';
            out32[8] = '\0';
            out32[9] = '\0';
            out32[10] = '\0';
            out32[0xb] = '\0';
            out32[0xc] = '\0';
            out32[0xd] = '\0';
            out32[0xe] = '\0';
            out32[0xf] = '\0';
            iVar5 = 0;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int ec_seckey_import_der(const secp256k1_context* ctx, unsigned char *out32, const unsigned char *seckey, size_t seckeylen) {
    const unsigned char *end = seckey + seckeylen;
    memset(out32, 0, 32);
    /* sequence header */
    if (end - seckey < 1 || *seckey != 0x30u) {
        return 0;
    }
    seckey++;
    /* sequence length constructor */
    if (end - seckey < 1 || !(*seckey & 0x80u)) {
        return 0;
    }
    ptrdiff_t lenb = *seckey & ~0x80u; seckey++;
    if (lenb < 1 || lenb > 2) {
        return 0;
    }
    if (end - seckey < lenb) {
        return 0;
    }
    /* sequence length */
    ptrdiff_t len = seckey[lenb-1] | (lenb > 1 ? seckey[lenb-2] << 8 : 0u);
    seckey += lenb;
    if (end - seckey < len) {
        return 0;
    }
    /* sequence element 0: version number (=1) */
    if (end - seckey < 3 || seckey[0] != 0x02u || seckey[1] != 0x01u || seckey[2] != 0x01u) {
        return 0;
    }
    seckey += 3;
    /* sequence element 1: octet string, up to 32 bytes */
    if (end - seckey < 2 || seckey[0] != 0x04u) {
        return 0;
    }
    ptrdiff_t oslen = seckey[1];
    seckey += 2;
    if (oslen > 32 || end - seckey < oslen) {
        return 0;
    }
    memcpy(out32 + (32 - oslen), seckey, oslen);
    if (!secp256k1_ec_seckey_verify(ctx, out32)) {
        memset(out32, 0, 32);
        return 0;
    }
    return 1;
}